

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O2

int handleAlias(poptContext con,char *longName,size_t longNameLen,char shortName,char *nextArg)

{
  poptItem ppVar1;
  poptItem ppVar2;
  int iVar3;
  char **argv;
  ulong uVar4;
  optionStackEntry *poVar5;
  ulong uVar6;
  long lVar7;
  uint argc;
  poptItem opt;
  
  poVar5 = con->os;
  ppVar1 = poVar5->currAlias;
  if ((((ppVar1 == (poptItem)0x0) ||
       ((((longName == (char *)0x0 || ((ppVar1->option).longName == (char *)0x0)) ||
         (iVar3 = longOptionStrcmp(&ppVar1->option,longName,longNameLen), iVar3 == 0)) &&
        ((shortName == '\0' || ((ppVar1->option).shortName != shortName)))))) &&
      (ppVar1 = con->aliases, ppVar1 != (poptItem)0x0)) &&
     (lVar7 = (long)con->numAliases, 0 < lVar7)) {
    ppVar2 = ppVar1 + lVar7;
    for (; opt = ppVar2 + -1, 0 < lVar7; lVar7 = lVar7 + -1) {
      if (longName == (char *)0x0) {
        if (ppVar2[-1].option.shortName == shortName) goto LAB_00104102;
      }
      else if (((opt->option).longName != (char *)0x0) &&
              (iVar3 = longOptionStrcmp(&opt->option,longName,longNameLen), iVar3 != 0)) {
LAB_00104102:
        if ((long)poVar5 - (long)con == 0x240) {
          return -0xd;
        }
        if ((nextArg != (char *)0x0 && longName == (char *)0x0) && (*nextArg != '\0')) {
          poVar5->nextCharArg = nextArg;
        }
        con->os = poVar5 + 1;
        poVar5[1].next = 0;
        poVar5[1].stuffed = 0;
        uVar6 = lVar7 - 1U & 0xffffffff;
        ppVar2 = ppVar1 + uVar6;
        poVar5[1].nextArg = (char *)0x0;
        poVar5[1].nextCharArg = (char *)0x0;
        poVar5[1].currAlias = ppVar2;
        argc = ppVar1[uVar6].argc;
        if ((longName != (char *)0x0 && nextArg != (char *)0x0) && (*nextArg != '\0')) {
          lVar7 = (long)(int)argc;
          argv = (char **)malloc(lVar7 * 8 + 0x10);
          if (argv != (char **)0x0) {
            uVar4 = 0;
            uVar6 = (ulong)argc;
            if ((int)argc < 1) {
              uVar6 = uVar4;
            }
            for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
              argv[uVar4] = ppVar2->argv[uVar4];
            }
            argv[lVar7] = nextArg;
            argv[lVar7 + 1] = (char *)0x0;
            argc = argc + 1;
LAB_001041dd:
            iVar3 = poptDupArgv(argc,argv,&poVar5[1].argc,&poVar5[1].argv);
            poVar5 = con->os;
            if ((argv != (char **)0x0) && (argv != poVar5->currAlias->argv)) {
              free(argv);
              poVar5 = con->os;
            }
            poVar5->argb = (pbm_set *)0x0;
            return iVar3 + (uint)(iVar3 == 0);
          }
        }
        argv = ppVar2->argv;
        goto LAB_001041dd;
      }
      ppVar2 = opt;
    }
  }
  return 0;
}

Assistant:

static int handleAlias(poptContext con,
		const char * longName, size_t longNameLen,
		char shortName,
		const char * nextArg)
{
    poptItem item = con->os->currAlias;
    int rc;
    int i;

    if (item) {
	if (longName && item->option.longName != NULL
	 && longOptionStrcmp(&item->option, longName, longNameLen))
	    return 0;
	else
	if (shortName && shortName == item->option.shortName)
	    return 0;
    }

    if (con->aliases == NULL || con->numAliases <= 0) /* XXX can't happen */
	return 0;

    for (i = con->numAliases - 1; i >= 0; i--) {
	item = con->aliases + i;
	if (longName) {
	    if (item->option.longName == NULL)
		continue;
	    if (!longOptionStrcmp(&item->option, longName, longNameLen))
		continue;
	} else if (shortName != item->option.shortName)
	    continue;
	break;
    }
    if (i < 0) return 0;

    if ((con->os - con->optionStack + 1) == POPT_OPTION_DEPTH)
	return POPT_ERROR_OPTSTOODEEP;

    if (longName == NULL && nextArg != NULL && *nextArg != '\0')
	con->os->nextCharArg = nextArg;

    con->os++;
    con->os->next = 0;
    con->os->stuffed = 0;
    con->os->nextArg = NULL;
    con->os->nextCharArg = NULL;
    con->os->currAlias = con->aliases + i;
    {	const char ** av;
	int ac = con->os->currAlias->argc;
	/* Append --foo=bar arg to alias argv array (if present). */ 
	if (longName && nextArg != NULL && *nextArg != '\0') {
	    av = malloc((ac + 1 + 1) * sizeof(*av));
	    if (av != NULL) {	/* XXX won't happen. */
		for (i = 0; i < ac; i++) {
		    av[i] = con->os->currAlias->argv[i];
		}
		av[ac++] = nextArg;
		av[ac] = NULL;
	    } else	/* XXX revert to old popt behavior if malloc fails. */
		av = con->os->currAlias->argv;
	} else
	    av = con->os->currAlias->argv;
	rc = poptDupArgv(ac, av, &con->os->argc, &con->os->argv);
	if (av != NULL && av != con->os->currAlias->argv)
	    free(av);
    }
    con->os->argb = NULL;

    return (rc ? rc : 1);
}